

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_stats_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 (*pauVar1) [32];
  long *plVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  uint uVar7;
  void *pvVar8;
  parasail_matrix_t *ppVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  __m256i c;
  __m256i c_00;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  __m256i a_12;
  __m256i a_13;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i b_12;
  __m256i b_13;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  int iVar21;
  parasail_result_t *ppVar22;
  __m256i *ptr;
  __m256i *palVar23;
  __m256i *b_14;
  __m256i *palVar24;
  __m256i *b_15;
  __m256i *palVar25;
  __m256i *b_16;
  __m256i *palVar26;
  __m256i *ptr_00;
  __m256i *b_17;
  __m256i *b_18;
  __m256i *b_19;
  int64_t *ptr_01;
  __m256i *palVar27;
  ulong uVar28;
  undefined8 uVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  longlong lVar34;
  char *pcVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  longlong lVar40;
  uint uVar41;
  __m256i *ptr_02;
  long lVar42;
  ulong uVar43;
  char *__format;
  long lVar44;
  __m256i *ptr_03;
  ulong uVar45;
  ulong uVar46;
  uint uVar47;
  __m256i *ptr_04;
  int iVar48;
  long lVar49;
  ulong uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar58 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  __m256i_64_t e;
  __m256i_64_t h;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  uint uVar71;
  undefined4 uVar72;
  int iVar73;
  longlong lVar74;
  undefined4 in_stack_fffffffffffffb20;
  long local_460;
  long lStack_458;
  long lStack_448;
  long local_440;
  long lStack_438;
  long lStack_428;
  undefined1 local_420 [32];
  long lStack_3b8;
  long lStack_3b0;
  long lStack_3a8;
  long local_320;
  long lStack_318;
  long lStack_310;
  long lStack_308;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  longlong local_a0 [4];
  ulong local_80 [10];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar35 = "profile";
  }
  else {
    pvVar8 = (profile->profile64).score;
    if (pvVar8 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar35 = "profile->profile64.score";
    }
    else {
      ppVar9 = profile->matrix;
      if (ppVar9 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar35 = "profile->matrix";
      }
      else {
        uVar7 = profile->s1Len;
        if ((int)uVar7 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar35 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar35 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar35 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar35 = "open";
        }
        else {
          if (-1 < gap) {
            uVar41 = uVar7 - 1;
            uVar50 = (ulong)uVar7 + 3 >> 2;
            uVar12 = (ulong)uVar41 % uVar50;
            iVar21 = (int)(uVar41 / uVar50);
            uVar46 = CONCAT44(0,open);
            iVar48 = -open;
            iVar30 = ppVar9->min;
            pvVar10 = (profile->profile64).matches;
            pvVar11 = (profile->profile64).similar;
            uVar39 = 0x8000000000000000 - (long)iVar30;
            if (iVar30 != iVar48 && SBORROW4(iVar30,iVar48) == iVar30 + open < 0) {
              uVar39 = uVar46 | 0x8000000000000000;
            }
            iVar30 = ppVar9->max;
            ppVar22 = parasail_result_new_stats();
            if (ppVar22 != (parasail_result_t *)0x0) {
              ppVar22->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar22->flag | 0x4810802;
              ptr = parasail_memalign___m256i(0x20,uVar50);
              palVar23 = parasail_memalign___m256i(0x20,uVar50);
              b_14 = parasail_memalign___m256i(0x20,uVar50);
              palVar24 = parasail_memalign___m256i(0x20,uVar50);
              b_15 = parasail_memalign___m256i(0x20,uVar50);
              palVar25 = parasail_memalign___m256i(0x20,uVar50);
              b_16 = parasail_memalign___m256i(0x20,uVar50);
              palVar26 = parasail_memalign___m256i(0x20,uVar50);
              ptr_00 = parasail_memalign___m256i(0x20,uVar50);
              b_17 = parasail_memalign___m256i(0x20,uVar50);
              b_18 = parasail_memalign___m256i(0x20,uVar50);
              b_19 = parasail_memalign___m256i(0x20,uVar50);
              uVar71 = (uint)uVar50;
              uVar72 = 0;
              ptr_01 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
              auVar57._8_8_ = 0;
              auVar57._0_8_ = ptr;
              auVar59._8_8_ = 0;
              auVar59._0_8_ = palVar23;
              auVar57 = vpunpcklqdq_avx(auVar57,auVar59);
              auVar51._8_8_ = 0;
              auVar51._0_8_ = b_14;
              auVar55._8_8_ = 0;
              auVar55._0_8_ = palVar24;
              auVar59 = vpunpcklqdq_avx(auVar51,auVar55);
              auVar51 = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar57;
              auVar55 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar59;
              auVar56._8_8_ = 0;
              auVar56._0_8_ = b_15;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = palVar25;
              auVar57 = vpunpcklqdq_avx(auVar56,auVar60);
              auVar61._8_8_ = 0;
              auVar61._0_8_ = b_16;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = palVar26;
              auVar59 = vpunpcklqdq_avx(auVar61,auVar63);
              auVar57 = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar57;
              auVar59 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar59;
              auVar52._0_8_ = -(ulong)(auVar51._0_8_ == 0);
              auVar52._8_8_ = -(ulong)(auVar51._8_8_ == 0);
              auVar52._16_8_ = -(ulong)(auVar55._0_8_ == 0);
              auVar52._24_8_ = -(ulong)(auVar55._8_8_ == 0);
              auVar58._0_8_ = -(ulong)(auVar57._0_8_ == 0);
              auVar58._8_8_ = -(ulong)(auVar57._8_8_ == 0);
              auVar58._16_8_ = -(ulong)(auVar59._0_8_ == 0);
              auVar58._24_8_ = -(ulong)(auVar59._8_8_ == 0);
              auVar52 = vpackssdw_avx2(auVar52,auVar58);
              if (((((b_17 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0) && b_18 != (__m256i *)0x0)
                   && b_19 != (__m256i *)0x0) && ptr_01 != (int64_t *)0x0) &&
                  ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar52 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar52 >> 0x7f,0) == '\0') &&
                     (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar52 >> 0xbf,0) == '\0') &&
                   (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar52[0x1f])) {
                iVar20 = s2Len + -1;
                iVar36 = 3 - iVar21;
                uVar28 = CONCAT44(0,gap);
                auVar53._8_4_ = gap;
                auVar53._0_8_ = uVar28;
                auVar53._12_4_ = 0;
                auVar53._16_4_ = gap;
                auVar53._20_4_ = 0;
                auVar53._24_4_ = gap;
                auVar53._28_4_ = 0;
                lVar31 = uVar39 + 1;
                lVar42 = 0x7ffffffffffffffe - (long)iVar30;
                alVar3[0]._4_4_ = in_stack_fffffffffffffb04;
                alVar3[0]._0_4_ = in_stack_fffffffffffffb00;
                alVar3[1]._0_4_ = uVar71;
                alVar3[1]._4_4_ = uVar72;
                alVar3[2] = (longlong)ptr;
                alVar3[3] = lVar31;
                lVar74 = lVar31;
                parasail_memset___m256i(b_14,alVar3,CONCAT44(uVar72,uVar71));
                alVar4[0]._4_4_ = in_stack_fffffffffffffb04;
                alVar4[0]._0_4_ = in_stack_fffffffffffffb00;
                alVar4[1]._0_4_ = uVar71;
                alVar4[1]._4_4_ = uVar72;
                alVar4[2] = (longlong)ptr;
                alVar4[3] = lVar74;
                parasail_memset___m256i(b_15,alVar4,CONCAT44(uVar72,uVar71));
                alVar5[0]._4_4_ = in_stack_fffffffffffffb04;
                alVar5[0]._0_4_ = in_stack_fffffffffffffb00;
                alVar5[1]._0_4_ = uVar71;
                alVar5[1]._4_4_ = uVar72;
                alVar5[2] = (longlong)ptr;
                alVar5[3] = lVar74;
                parasail_memset___m256i(b_16,alVar5,CONCAT44(uVar72,uVar71));
                alVar6[0]._4_4_ = in_stack_fffffffffffffb04;
                alVar6[0]._0_4_ = in_stack_fffffffffffffb00;
                alVar6[1]._0_4_ = uVar71;
                alVar6[1]._4_4_ = uVar72;
                alVar6[2] = (longlong)ptr;
                alVar6[3] = lVar74;
                parasail_memset___m256i(b_17,alVar6,CONCAT44(uVar72,uVar71));
                c[0]._4_4_ = in_stack_fffffffffffffb04;
                c[0]._0_4_ = in_stack_fffffffffffffb00;
                c[1]._0_4_ = uVar71;
                c[1]._4_4_ = uVar72;
                c[2] = (longlong)ptr;
                c[3] = lVar74;
                parasail_memset___m256i(b_18,c,CONCAT44(uVar72,uVar71));
                c_00[0]._4_4_ = in_stack_fffffffffffffb04;
                c_00[0]._0_4_ = in_stack_fffffffffffffb00;
                c_00[1]._0_4_ = uVar71;
                c_00[1]._4_4_ = uVar72;
                c_00[2] = (longlong)ptr;
                c_00[3] = lVar74;
                parasail_memset___m256i(b_19,c_00,CONCAT44(uVar72,uVar71));
                uVar50 = (ulong)iVar48;
                uVar39 = uVar50;
                for (lVar32 = 0; lVar32 != CONCAT44(uVar72,uVar71); lVar32 = lVar32 + 1) {
                  uVar43 = uVar39;
                  for (lVar44 = 0; lVar44 != 4; lVar44 = lVar44 + 1) {
                    uVar45 = uVar43;
                    if (s1_beg != 0) {
                      uVar45 = 0;
                    }
                    local_80[lVar44] = uVar45;
                    local_a0[lVar44] = uVar45 - uVar46;
                    uVar43 = uVar43 - CONCAT44(uVar72,uVar71) * uVar28;
                  }
                  palVar27 = ptr + lVar32;
                  (*palVar27)[0] = local_80[0];
                  (*palVar27)[1] = local_80[1];
                  (*palVar27)[2] = local_80[2];
                  (*palVar27)[3] = local_80[3];
                  palVar27 = ptr_00 + lVar32;
                  (*palVar27)[0] = local_a0[0];
                  (*palVar27)[1] = local_a0[1];
                  (*palVar27)[2] = local_a0[2];
                  (*palVar27)[3] = local_a0[3];
                  uVar39 = uVar39 - uVar28;
                }
                *ptr_01 = 0;
                for (uVar39 = 1; s2Len + 1 != uVar39; uVar39 = uVar39 + 1) {
                  iVar30 = 0;
                  if (s2_beg == 0) {
                    iVar30 = iVar48;
                  }
                  ptr_01[uVar39] = (long)iVar30;
                  iVar48 = iVar48 - gap;
                }
                uVar37 = uVar71 - 1;
                lVar44 = CONCAT44(uVar72,uVar71) << 5;
                uVar39 = 0;
                local_2a0._8_8_ = lVar31;
                local_2a0._0_8_ = lVar31;
                local_2a0._16_8_ = lVar31;
                local_2a0._24_8_ = lVar31;
                local_280._8_8_ = lVar31;
                local_280._0_8_ = lVar31;
                local_280._16_8_ = lVar31;
                local_280._24_8_ = lVar31;
                local_260._8_8_ = lVar31;
                local_260._0_8_ = lVar31;
                local_260._16_8_ = lVar31;
                local_260._24_8_ = lVar31;
                local_240._8_8_ = lVar31;
                local_240._0_8_ = lVar31;
                local_240._16_8_ = lVar31;
                local_240._24_8_ = lVar31;
                iVar30 = iVar20;
                lStack_3b8 = lVar42;
                lStack_3b0 = lVar42;
                lStack_3a8 = lVar42;
                local_320 = lVar31;
                lStack_318 = lVar31;
                lStack_310 = lVar31;
                lStack_308 = lVar31;
                lVar32 = lVar42;
                do {
                  ptr_04 = palVar25;
                  ptr_03 = palVar26;
                  ptr_02 = palVar24;
                  palVar27 = palVar23;
                  if (uVar39 == (uint)s2Len) {
                    uVar39 = 0;
                    if (s2_end == 0) {
                      lVar34 = 0;
                      lVar40 = 0;
                    }
                    else {
                      for (; (int)uVar39 < iVar36; uVar39 = (ulong)((int)uVar39 + 1)) {
                        auVar52 = vperm2f128_avx(local_2a0,local_2a0,8);
                        local_2a0 = vpalignr_avx2(local_2a0,auVar52,8);
                        auVar52 = vperm2i128_avx2(local_280,local_280,8);
                        local_280 = vpalignr_avx2(local_280,auVar52,8);
                        auVar52 = vperm2i128_avx2(local_260,local_260,8);
                        local_260 = vpalignr_avx2(local_260,auVar52,8);
                        auVar52 = vperm2i128_avx2(local_240,local_240,8);
                        local_240 = vpalignr_avx2(local_240,auVar52,8);
                      }
                      lVar74 = vpextrq_avx(local_2a0._16_16_,1);
                      uVar39 = vpextrq_avx(local_280._16_16_,1);
                      lVar34 = vpextrq_avx(local_260._16_16_,1);
                      lVar40 = vpextrq_avx(local_240._16_16_,1);
                    }
                    iVar38 = (int)lVar40;
                    iVar48 = (int)lVar34;
                    iVar21 = (int)uVar39;
                    uVar37 = uVar41;
                    if (s1_end != 0) {
                      uVar46 = 0;
                      while( true ) {
                        iVar38 = (int)lVar40;
                        iVar48 = (int)lVar34;
                        iVar21 = (int)uVar39;
                        if ((uVar71 & 0x1fffffff) << 2 == (uint)uVar46) break;
                        uVar47 = ((uint)uVar46 & 3) * uVar71 + ((uint)(uVar46 >> 2) & 0x3fffffff);
                        lVar44 = lVar74;
                        if ((int)uVar47 < (int)uVar7) {
                          lVar33 = (*ptr)[uVar46];
                          lVar44 = lVar33;
                          if ((lVar74 < lVar33) ||
                             (((lVar44 = lVar74, lVar33 == lVar74 && (iVar20 == iVar30)) &&
                              ((int)uVar47 < (int)uVar37)))) {
                            uVar39 = (*b_14)[uVar46];
                            lVar34 = (*b_15)[uVar46];
                            lVar40 = (*b_16)[uVar46];
                            iVar20 = iVar30;
                            uVar37 = uVar47;
                          }
                        }
                        uVar46 = uVar46 + 1;
                        lVar74 = lVar44;
                      }
                    }
                    iVar73 = (int)lVar74;
                    if (s2_end == 0 && s1_end == 0) {
                      alVar3 = ptr[uVar12];
                      alVar4 = b_14[uVar12];
                      alVar5 = b_15[uVar12];
                      alVar6 = b_16[uVar12];
                      for (iVar21 = 0; iVar21 < iVar36; iVar21 = iVar21 + 1) {
                        auVar52 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,
                                                  8);
                        alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar52,8);
                        auVar52 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,
                                                  8);
                        alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar52,8);
                        auVar52 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,
                                                  8);
                        alVar5 = (__m256i)vpalignr_avx2((undefined1  [32])alVar5,auVar52,8);
                        auVar52 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,
                                                  8);
                        alVar6 = (__m256i)vpalignr_avx2((undefined1  [32])alVar6,auVar52,8);
                      }
                      uVar29 = vpextrq_avx(alVar3._16_16_,1);
                      iVar73 = (int)uVar29;
                      uVar29 = vpextrq_avx(alVar4._16_16_,1);
                      iVar21 = (int)uVar29;
                      uVar29 = vpextrq_avx(alVar5._16_16_,1);
                      iVar48 = (int)uVar29;
                      uVar29 = vpextrq_avx(alVar6._16_16_,1);
                      iVar38 = (int)uVar29;
                      uVar37 = uVar41;
                      iVar20 = iVar30;
                    }
                    auVar54._8_8_ = lVar31;
                    auVar54._0_8_ = lVar31;
                    auVar54._16_8_ = lVar31;
                    auVar54._24_8_ = lVar31;
                    auVar17._8_8_ = lStack_3b8;
                    auVar17._0_8_ = lVar32;
                    auVar17._16_8_ = lStack_3b0;
                    auVar17._24_8_ = lStack_3a8;
                    auVar52 = vpcmpgtq_avx2(auVar54,auVar17);
                    auVar18._8_8_ = lStack_318;
                    auVar18._0_8_ = local_320;
                    auVar18._16_8_ = lStack_310;
                    auVar18._24_8_ = lStack_308;
                    auVar19._8_8_ = lVar42;
                    auVar19._0_8_ = lVar42;
                    auVar19._16_8_ = lVar42;
                    auVar19._24_8_ = lVar42;
                    auVar58 = vpcmpgtq_avx2(auVar18,auVar19);
                    auVar52 = vpor_avx2(auVar58,auVar52);
                    if ((((auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         SUB321(auVar52 >> 0x7f,0) != '\0') || SUB321(auVar52 >> 0xbf,0) != '\0') ||
                        auVar52[0x1f] < '\0') {
                      *(byte *)&ppVar22->flag = (byte)ppVar22->flag | 0x40;
                      iVar73 = 0;
                      iVar21 = 0;
                      iVar48 = 0;
                      iVar38 = 0;
                      iVar20 = 0;
                      uVar37 = 0;
                    }
                    ppVar22->score = iVar73;
                    ppVar22->end_query = uVar37;
                    ppVar22->end_ref = iVar20;
                    ((ppVar22->field_4).stats)->matches = iVar21;
                    ((ppVar22->field_4).stats)->similar = iVar48;
                    ((ppVar22->field_4).stats)->length = iVar38;
                    parasail_free(ptr_01);
                    parasail_free(b_19);
                    parasail_free(b_18);
                    parasail_free(b_17);
                    parasail_free(ptr_00);
                    parasail_free(ptr_03);
                    parasail_free(b_16);
                    parasail_free(ptr_04);
                    parasail_free(b_15);
                    parasail_free(ptr_02);
                    parasail_free(b_14);
                    parasail_free(palVar27);
                    parasail_free(ptr);
                    return ppVar22;
                  }
                  palVar23 = ptr + uVar37;
                  alVar3 = ptr[uVar37];
                  alVar4 = b_14[uVar37];
                  alVar5 = b_15[uVar37];
                  alVar6 = b_16[uVar37];
                  auVar57 = alVar3._0_16_;
                  auVar65._0_16_ = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar57;
                  auVar65._16_16_ = ZEXT116(0) * alVar3._16_16_ + ZEXT116(1) * auVar57;
                  auVar52 = vpalignr_avx2((undefined1  [32])alVar3,auVar65,8);
                  auVar58 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                  auVar58 = vpalignr_avx2((undefined1  [32])alVar4,auVar58,8);
                  auVar65 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,8);
                  auVar65 = vpalignr_avx2((undefined1  [32])alVar5,auVar65,8);
                  auVar16 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,8);
                  auVar16 = vpalignr_avx2((undefined1  [32])alVar6,auVar16,8);
                  auVar52 = vpblendd_avx2(auVar52,ZEXT832((ulong)ptr_01[uVar39]),3);
                  lVar33 = (long)(int)(ppVar9->mapper[(byte)s2[uVar39]] * uVar71) * 0x20;
                  auVar67 = ZEXT1664((undefined1  [16])0x0);
                  auVar70._8_8_ = lVar31;
                  auVar70._0_8_ = lVar31;
                  auVar70._16_8_ = lVar31;
                  auVar70._24_8_ = lVar31;
                  auVar69 = ZEXT1664((undefined1  [16])0x0);
                  auVar13._8_8_ = 1;
                  auVar13._0_8_ = 1;
                  auVar13._16_8_ = 1;
                  auVar13._24_8_ = 1;
                  palVar24 = ptr_03;
                  for (lVar49 = 0; lVar44 != lVar49; lVar49 = lVar49 + 0x20) {
                    auVar14 = *(undefined1 (*) [32])((long)*ptr_00 + lVar49);
                    auVar15 = *(undefined1 (*) [32])((long)*b_17 + lVar49);
                    auVar17 = *(undefined1 (*) [32])((long)*b_18 + lVar49);
                    pauVar1 = (undefined1 (*) [32])((long)*b_19 + lVar49);
                    auVar18 = *pauVar1;
                    auVar62 = *pauVar1;
                    auVar52 = vpaddq_avx2(auVar52,*(undefined1 (*) [32])
                                                   ((long)pvVar8 + lVar49 + lVar33));
                    a[0]._4_4_ = iVar20;
                    a[0]._0_4_ = in_stack_fffffffffffffb00;
                    a[1]._0_4_ = uVar71;
                    a[1]._4_4_ = uVar72;
                    a[2] = (longlong)ptr;
                    a[3] = lVar74;
                    b[0]._4_4_ = iVar30;
                    b[0]._0_4_ = in_stack_fffffffffffffb20;
                    b[1] = (longlong)ptr_01;
                    b[2] = (longlong)b_16;
                    b[3] = (longlong)b_15;
                    auVar64 = auVar52;
                    _mm256_max_epi64_rpl(palVar24,a,b);
                    a_00[0]._4_4_ = iVar20;
                    a_00[0]._0_4_ = in_stack_fffffffffffffb00;
                    a_00[1]._0_4_ = uVar71;
                    a_00[1]._4_4_ = uVar72;
                    a_00[2] = (longlong)ptr;
                    a_00[3] = lVar74;
                    b_00[0]._4_4_ = iVar30;
                    b_00[0]._0_4_ = in_stack_fffffffffffffb20;
                    b_00[1] = (longlong)ptr_01;
                    b_00[2] = (longlong)b_16;
                    b_00[3] = (longlong)b_15;
                    _mm256_max_epi64_rpl(palVar24,a_00,b_00);
                    *(undefined1 (*) [32])((long)*palVar27 + lVar49) = auVar64;
                    local_420._0_8_ = auVar52._0_8_;
                    auVar66._0_8_ = -(ulong)(auVar64._0_8_ == local_420._0_8_);
                    local_420._8_8_ = auVar52._8_8_;
                    auVar66._8_8_ = -(ulong)(auVar64._8_8_ == local_420._8_8_);
                    auVar66._16_8_ = -(ulong)(auVar64._16_8_ == auVar52._16_8_);
                    local_420._24_8_ = auVar52._24_8_;
                    auVar66._24_8_ = -(ulong)(auVar64._24_8_ == local_420._24_8_);
                    local_440 = auVar70._0_8_;
                    auVar68._0_8_ = -(ulong)(auVar64._0_8_ == local_440);
                    lStack_438 = auVar70._8_8_;
                    auVar68._8_8_ = -(ulong)(auVar64._8_8_ == lStack_438);
                    auVar68._16_8_ = -(ulong)(auVar64._16_8_ == auVar70._16_8_);
                    lStack_428 = auVar70._24_8_;
                    auVar68._24_8_ = -(ulong)(auVar64._24_8_ == lStack_428);
                    auVar52 = vblendvpd_avx(auVar15,auVar67._0_32_,auVar68);
                    auVar58 = vpaddq_avx2(auVar58,*(undefined1 (*) [32])
                                                   ((long)pvVar10 + lVar49 + lVar33));
                    auVar52 = vblendvpd_avx(auVar52,auVar58,auVar66);
                    *(undefined1 (*) [32])((long)*ptr_02 + lVar49) = auVar52;
                    auVar58 = vblendvpd_avx(auVar17,auVar69._0_32_,auVar68);
                    auVar65 = vpaddq_avx2(auVar65,*(undefined1 (*) [32])
                                                   ((long)pvVar11 + lVar49 + lVar33));
                    auVar58 = vblendvpd_avx(auVar58,auVar65,auVar66);
                    *(undefined1 (*) [32])((long)*ptr_04 + lVar49) = auVar58;
                    auVar65 = vblendvpd_avx(auVar62,auVar13,auVar68);
                    auVar62 = vpcmpeqd_avx2(auVar62,auVar62);
                    auVar16 = vpsubq_avx2(auVar16,auVar62);
                    auVar65 = vblendvpd_avx(auVar65,auVar16,auVar66);
                    *(undefined1 (*) [32])((long)*ptr_03 + lVar49) = auVar65;
                    a_01[0]._4_4_ = iVar20;
                    a_01[0]._0_4_ = in_stack_fffffffffffffb00;
                    a_01[1]._0_4_ = uVar71;
                    a_01[1]._4_4_ = uVar72;
                    a_01[2] = (longlong)ptr;
                    a_01[3] = lVar74;
                    b_01[0]._4_4_ = iVar30;
                    b_01[0]._0_4_ = in_stack_fffffffffffffb20;
                    b_01[1] = (longlong)ptr_01;
                    b_01[2] = (longlong)b_16;
                    b_01[3] = (longlong)b_15;
                    _mm256_min_epi64_rpl(palVar24,a_01,b_01);
                    a_02[0]._4_4_ = iVar20;
                    a_02[0]._0_4_ = in_stack_fffffffffffffb00;
                    a_02[1]._0_4_ = uVar71;
                    a_02[1]._4_4_ = uVar72;
                    a_02[2] = (longlong)ptr;
                    a_02[3] = lVar74;
                    b_02[0]._4_4_ = iVar30;
                    b_02[0]._0_4_ = in_stack_fffffffffffffb20;
                    b_02[1] = (longlong)ptr_01;
                    b_02[2] = (longlong)b_16;
                    b_02[3] = (longlong)b_15;
                    _mm256_max_epi64_rpl(palVar24,a_02,b_02);
                    a_03[0]._4_4_ = iVar20;
                    a_03[0]._0_4_ = in_stack_fffffffffffffb00;
                    a_03[1]._0_4_ = uVar71;
                    a_03[1]._4_4_ = uVar72;
                    a_03[2] = (longlong)ptr;
                    a_03[3] = lVar74;
                    b_03[0]._4_4_ = iVar30;
                    b_03[0]._0_4_ = in_stack_fffffffffffffb20;
                    b_03[1] = (longlong)ptr_01;
                    b_03[2] = (longlong)b_16;
                    b_03[3] = (longlong)b_15;
                    _mm256_max_epi64_rpl(palVar24,a_03,b_03);
                    a_04[0]._4_4_ = iVar20;
                    a_04[0]._0_4_ = in_stack_fffffffffffffb00;
                    a_04[1]._0_4_ = uVar71;
                    a_04[1]._4_4_ = uVar72;
                    a_04[2] = (longlong)ptr;
                    a_04[3] = lVar74;
                    b_04[0]._4_4_ = iVar30;
                    b_04[0]._0_4_ = in_stack_fffffffffffffb20;
                    b_04[1] = (longlong)ptr_01;
                    b_04[2] = (longlong)b_16;
                    b_04[3] = (longlong)b_15;
                    _mm256_max_epi64_rpl(palVar24,a_04,b_04);
                    a_05[0]._4_4_ = iVar20;
                    a_05[0]._0_4_ = in_stack_fffffffffffffb00;
                    a_05[1]._0_4_ = uVar71;
                    a_05[1]._4_4_ = uVar72;
                    a_05[2] = (longlong)ptr;
                    a_05[3] = lVar74;
                    b_05[0]._4_4_ = iVar30;
                    b_05[0]._0_4_ = in_stack_fffffffffffffb20;
                    b_05[1] = (longlong)ptr_01;
                    b_05[2] = (longlong)b_16;
                    b_05[3] = (longlong)b_15;
                    _mm256_max_epi64_rpl(palVar24,a_05,b_05);
                    auVar16._8_4_ = open;
                    auVar16._0_8_ = uVar46;
                    auVar16._12_4_ = 0;
                    auVar16._16_4_ = open;
                    auVar16._20_4_ = 0;
                    auVar16._24_4_ = open;
                    auVar16._28_4_ = 0;
                    auVar66 = vpsubq_avx2(auVar64,auVar16);
                    auVar16 = vpsubq_avx2(auVar14,auVar53);
                    a_06[0]._4_4_ = iVar20;
                    a_06[0]._0_4_ = in_stack_fffffffffffffb00;
                    a_06[1]._0_4_ = uVar71;
                    a_06[1]._4_4_ = uVar72;
                    a_06[2] = (longlong)ptr;
                    a_06[3] = lVar74;
                    b_06[0]._4_4_ = iVar30;
                    b_06[0]._0_4_ = in_stack_fffffffffffffb20;
                    b_06[1] = (longlong)ptr_01;
                    b_06[2] = (longlong)b_16;
                    b_06[3] = (longlong)b_15;
                    auVar54 = auVar66;
                    _mm256_max_epi64_rpl(palVar24,a_06,b_06);
                    auVar64 = vpcmpgtq_avx2(auVar66,auVar16);
                    auVar16 = vblendvpd_avx(auVar15,auVar52,auVar64);
                    auVar62 = vblendvpd_avx(auVar17,auVar58,auVar64);
                    auVar14 = vpcmpeqd_avx2(auVar68,auVar68);
                    auVar15 = vpsubq_avx2(auVar18,auVar14);
                    auVar14 = vpsubq_avx2(auVar65,auVar14);
                    auVar65 = vblendvpd_avx(auVar15,auVar14,auVar64);
                    *(undefined1 (*) [32])((long)*ptr_00 + lVar49) = auVar54;
                    *(undefined1 (*) [32])((long)*b_17 + lVar49) = auVar16;
                    *(undefined1 (*) [32])((long)*b_18 + lVar49) = auVar62;
                    *(undefined1 (*) [32])((long)*b_19 + lVar49) = auVar65;
                    auVar65 = vpsubq_avx2(auVar70,auVar53);
                    a_07[0]._4_4_ = iVar20;
                    a_07[0]._0_4_ = in_stack_fffffffffffffb00;
                    a_07[1]._0_4_ = uVar71;
                    a_07[1]._4_4_ = uVar72;
                    a_07[2] = (longlong)ptr;
                    a_07[3] = lVar74;
                    b_07[0]._4_4_ = iVar30;
                    b_07[0]._0_4_ = in_stack_fffffffffffffb20;
                    b_07[1] = (longlong)ptr_01;
                    b_07[2] = (longlong)b_16;
                    b_07[3] = (longlong)b_15;
                    auVar70 = auVar66;
                    _mm256_max_epi64_rpl(palVar24,a_07,b_07);
                    auVar65 = vpcmpgtq_avx2(auVar66,auVar65);
                    auVar52 = vblendvpd_avx(auVar67._0_32_,auVar52,auVar65);
                    auVar67 = ZEXT3264(auVar52);
                    auVar52 = vblendvpd_avx(auVar69._0_32_,auVar58,auVar65);
                    auVar69 = ZEXT3264(auVar52);
                    auVar52 = vpsubq_avx2(auVar13,_DAT_008a5a80);
                    auVar13 = vblendvpd_avx(auVar52,auVar14,auVar65);
                    auVar52 = *(undefined1 (*) [32])((long)*ptr + lVar49);
                    auVar58 = *(undefined1 (*) [32])((long)*b_14 + lVar49);
                    auVar65 = *(undefined1 (*) [32])((long)*b_15 + lVar49);
                    auVar16 = *(undefined1 (*) [32])((long)*b_16 + lVar49);
                  }
                  palVar26 = b_16;
                  for (iVar48 = 0; iVar48 != 4; iVar48 = iVar48 + 1) {
                    uVar28 = uVar50;
                    if (s2_beg == 0) {
                      uVar28 = ptr_01[uVar39 + 1] - uVar46;
                    }
                    auVar16 = vpermq_avx2((undefined1  [32])*palVar23,0x90);
                    auVar70 = vpermq_avx2(auVar70,0x90);
                    auVar58 = auVar67._0_32_;
                    auVar52 = vperm2i128_avx2(auVar58,auVar58,8);
                    auVar58 = vpalignr_avx2(auVar58,auVar52,8);
                    auVar65 = auVar69._0_32_;
                    auVar52 = vperm2i128_avx2(auVar65,auVar65,8);
                    auVar65 = vpalignr_avx2(auVar65,auVar52,8);
                    auVar13 = vpermq_avx2(auVar13,0x90);
                    auVar52 = vpblendd_avx2(auVar16,ZEXT832((ulong)ptr_01[uVar39]),3);
                    auVar70 = vpblendd_avx2(auVar70,ZEXT832(uVar28),3);
                    auVar13 = vpblendd_avx2(auVar13,ZEXT832(1),3);
                    lVar49 = 0;
                    while( true ) {
                      auVar69 = ZEXT3264(auVar65);
                      auVar67 = ZEXT3264(auVar58);
                      if (lVar44 == lVar49) break;
                      auVar52 = vpaddq_avx2(auVar52,*(undefined1 (*) [32])
                                                     ((long)pvVar8 + lVar49 + lVar33));
                      plVar2 = (long *)((long)*palVar27 + lVar49);
                      local_420._0_8_ = *plVar2;
                      local_420._8_8_ = plVar2[1];
                      local_420._16_8_ = plVar2[2];
                      local_420._24_8_ = plVar2[3];
                      a_08[0]._4_4_ = iVar20;
                      a_08[0]._0_4_ = in_stack_fffffffffffffb00;
                      a_08[1]._0_4_ = uVar71;
                      a_08[1]._4_4_ = uVar72;
                      a_08[2] = (longlong)ptr;
                      a_08[3] = lVar74;
                      b_08[0]._4_4_ = iVar30;
                      b_08[0]._0_4_ = in_stack_fffffffffffffb20;
                      b_08[1] = (longlong)ptr_01;
                      b_08[2] = (longlong)palVar26;
                      b_08[3] = (longlong)b_15;
                      _mm256_max_epi64_rpl(palVar24,a_08,b_08);
                      plVar2 = (long *)((long)*palVar27 + lVar49);
                      *plVar2 = local_420._0_8_;
                      plVar2[1] = local_420._8_8_;
                      plVar2[2] = local_420._16_8_;
                      plVar2[3] = local_420._24_8_;
                      local_440 = auVar70._0_8_;
                      auVar62._0_8_ = -(ulong)(local_420._0_8_ == local_440);
                      lStack_438 = auVar70._8_8_;
                      auVar62._8_8_ = -(ulong)(local_420._8_8_ == lStack_438);
                      auVar62._16_8_ = -(ulong)(local_420._16_8_ == auVar70._16_8_);
                      lStack_428 = auVar70._24_8_;
                      auVar62._24_8_ = -(ulong)(local_420._24_8_ == lStack_428);
                      local_460 = auVar52._0_8_;
                      auVar64._0_8_ = -(ulong)(local_420._0_8_ == local_460);
                      lStack_458 = auVar52._8_8_;
                      auVar64._8_8_ = -(ulong)(local_420._8_8_ == lStack_458);
                      auVar64._16_8_ = -(ulong)(local_420._16_8_ == auVar52._16_8_);
                      lStack_448 = auVar52._24_8_;
                      auVar64._24_8_ = -(ulong)(local_420._24_8_ == lStack_448);
                      auVar62 = vpandn_avx2(auVar64,auVar62);
                      auVar52 = vblendvpd_avx(*(undefined1 (*) [32])((long)*ptr_02 + lVar49),auVar58
                                              ,auVar62);
                      *(undefined1 (*) [32])((long)*ptr_02 + lVar49) = auVar52;
                      auVar16 = vblendvpd_avx(*(undefined1 (*) [32])((long)*ptr_04 + lVar49),auVar65
                                              ,auVar62);
                      *(undefined1 (*) [32])((long)*ptr_04 + lVar49) = auVar16;
                      auVar62 = vblendvpd_avx(*(undefined1 (*) [32])((long)*ptr_03 + lVar49),auVar13
                                              ,auVar62);
                      *(undefined1 (*) [32])((long)*ptr_03 + lVar49) = auVar62;
                      a_09[0]._4_4_ = iVar20;
                      a_09[0]._0_4_ = in_stack_fffffffffffffb00;
                      a_09[1]._0_4_ = uVar71;
                      a_09[1]._4_4_ = uVar72;
                      a_09[2] = (longlong)ptr;
                      a_09[3] = lVar74;
                      b_09[0]._4_4_ = iVar30;
                      b_09[0]._0_4_ = in_stack_fffffffffffffb20;
                      b_09[1] = (longlong)ptr_01;
                      b_09[2] = (longlong)palVar26;
                      b_09[3] = (longlong)b_15;
                      _mm256_min_epi64_rpl(palVar24,a_09,b_09);
                      a_10[0]._4_4_ = iVar20;
                      a_10[0]._0_4_ = in_stack_fffffffffffffb00;
                      a_10[1]._0_4_ = uVar71;
                      a_10[1]._4_4_ = uVar72;
                      a_10[2] = (longlong)ptr;
                      a_10[3] = lVar74;
                      b_10[0]._4_4_ = iVar30;
                      b_10[0]._0_4_ = in_stack_fffffffffffffb20;
                      b_10[1] = (longlong)ptr_01;
                      b_10[2] = (longlong)palVar26;
                      b_10[3] = (longlong)b_15;
                      _mm256_max_epi64_rpl(palVar24,a_10,b_10);
                      a_11[0]._4_4_ = iVar20;
                      a_11[0]._0_4_ = in_stack_fffffffffffffb00;
                      a_11[1]._0_4_ = uVar71;
                      a_11[1]._4_4_ = uVar72;
                      a_11[2] = (longlong)ptr;
                      a_11[3] = lVar74;
                      b_11[0]._4_4_ = iVar30;
                      b_11[0]._0_4_ = in_stack_fffffffffffffb20;
                      b_11[1] = (longlong)ptr_01;
                      b_11[2] = (longlong)palVar26;
                      b_11[3] = (longlong)b_15;
                      _mm256_max_epi64_rpl(palVar24,a_11,b_11);
                      a_12[0]._4_4_ = iVar20;
                      a_12[0]._0_4_ = in_stack_fffffffffffffb00;
                      a_12[1]._0_4_ = uVar71;
                      a_12[1]._4_4_ = uVar72;
                      a_12[2] = (longlong)ptr;
                      a_12[3] = lVar74;
                      b_12[0]._4_4_ = iVar30;
                      b_12[0]._0_4_ = in_stack_fffffffffffffb20;
                      b_12[1] = (longlong)ptr_01;
                      b_12[2] = (longlong)palVar26;
                      b_12[3] = (longlong)b_15;
                      _mm256_max_epi64_rpl(palVar24,a_12,b_12);
                      a_13[0]._4_4_ = iVar20;
                      a_13[0]._0_4_ = in_stack_fffffffffffffb00;
                      a_13[1]._0_4_ = uVar71;
                      a_13[1]._4_4_ = uVar72;
                      a_13[2] = (longlong)ptr;
                      a_13[3] = lVar74;
                      b_13[0]._4_4_ = iVar30;
                      b_13[0]._0_4_ = in_stack_fffffffffffffb20;
                      b_13[1] = (longlong)ptr_01;
                      b_13[2] = (longlong)palVar26;
                      b_13[3] = (longlong)b_15;
                      auVar64 = auVar62;
                      _mm256_max_epi64_rpl(palVar24,a_13,b_13);
                      auVar14._8_4_ = open;
                      auVar14._0_8_ = uVar46;
                      auVar14._12_4_ = 0;
                      auVar14._16_4_ = open;
                      auVar14._20_4_ = 0;
                      auVar14._24_4_ = open;
                      auVar14._28_4_ = 0;
                      auVar14 = vpsubq_avx2(local_420,auVar14);
                      auVar70 = vpsubq_avx2(auVar70,auVar53);
                      auVar66 = vpcmpgtq_avx2(auVar14,auVar70);
                      auVar64 = vpcmpeqd_avx2(auVar64,auVar64);
                      auVar14 = auVar64 & ~auVar66;
                      if ((((auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           SUB321(auVar14 >> 0x7f,0) == '\0') && SUB321(auVar14 >> 0xbf,0) == '\0')
                          && -1 < auVar14[0x1f]) goto LAB_0073ec88;
                      auVar58 = vblendvpd_avx(auVar58,auVar52,auVar66);
                      auVar65 = vblendvpd_avx(auVar65,auVar16,auVar66);
                      auVar52 = vblendvpd_avx(auVar13,auVar62,auVar66);
                      auVar13 = vpsubq_avx2(auVar52,auVar64);
                      auVar52 = *(undefined1 (*) [32])((long)*ptr + lVar49);
                      lVar49 = lVar49 + 0x20;
                    }
                  }
LAB_0073ec88:
                  auVar52 = vpcmpgtq_avx2((undefined1  [32])palVar27[uVar12],local_2a0);
                  local_2a0 = vblendvpd_avx(local_2a0,(undefined1  [32])palVar27[uVar12],auVar52);
                  local_280 = vblendvpd_avx(local_280,(undefined1  [32])ptr_02[uVar12],auVar52);
                  local_260 = vblendvpd_avx(local_260,(undefined1  [32])ptr_04[uVar12],auVar52);
                  local_240 = vblendvpd_avx(local_240,(undefined1  [32])ptr_03[uVar12],auVar52);
                  auVar15._8_8_ = -(ulong)(iVar36 == 2);
                  auVar15._0_8_ = -(ulong)(iVar36 == 3);
                  auVar15._16_8_ = -(ulong)(iVar36 == 1);
                  auVar15._24_8_ = -(ulong)(iVar21 == 3);
                  auVar15 = auVar15 & auVar52;
                  if ((((auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar15 >> 0x7f,0) != '\0') || SUB321(auVar15 >> 0xbf,0) != '\0') ||
                      auVar15[0x1f] < '\0') {
                    iVar20 = (int)uVar39;
                  }
                  uVar39 = uVar39 + 1;
                  palVar23 = ptr;
                  palVar24 = b_14;
                  palVar26 = b_16;
                  palVar25 = b_15;
                  b_15 = ptr_04;
                  b_16 = ptr_03;
                  b_14 = ptr_02;
                  ptr = palVar27;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar35 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_stats_striped_profile_avx2_256_64",pcVar35);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHM;
    __m256i vMaxHS;
    __m256i vMaxHL;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m256i*)profile->profile64.score;
    vProfileM = (__m256i*)profile->profile64.matches;
    vProfileS = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    boundary  = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);
        vHM = _mm256_slli_si256_rpl(vHM, 8);
        vHS = _mm256_slli_si256_rpl(vHS, 8);
        vHL = _mm256_slli_si256_rpl(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi64_rpl(vH_dag, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);

            case1 = _mm256_cmpeq_epi64(vH, vH_dag);
            case2 = _mm256_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vHM, _mm256_load_si256(vPM + i)),
                    case1);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vHS, _mm256_load_si256(vPS + i)),
                    case1);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm256_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vEL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vFL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm256_slli_si256_rpl(vHp, 8);
            vF = _mm256_slli_si256_rpl(vF, 8);
            vFM = _mm256_slli_si256_rpl(vFM, 8);
            vFS = _mm256_slli_si256_rpl(vFS, 8);
            vFL = _mm256_slli_si256_rpl(vFL, 8);
            vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm256_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi64(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi64(vH, vHp);
                case2 = _mm256_cmpeq_epi64(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi64(vH, vGapO);
                vF_ext = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi64(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi64(vFL, vOne),
                        _mm256_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            cond_max = _mm256_cmpgt_epi64(vH, vMaxH);
            vMaxH = _mm256_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm256_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm256_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm256_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
            vMaxHM = _mm256_slli_si256_rpl(vMaxHM, 8);
            vMaxHS = _mm256_slli_si256_rpl(vMaxHS, 8);
            vMaxHL = _mm256_slli_si256_rpl(vMaxHL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl(vMaxHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl(vMaxHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl(vMaxHL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int64_t *m = (int64_t*)pvHMStore;
        int64_t *s = (int64_t*)pvHSStore;
        int64_t *l = (int64_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        __m256i vHM = _mm256_load_si256(pvHMStore + offset);
        __m256i vHS = _mm256_load_si256(pvHSStore + offset);
        __m256i vHL = _mm256_load_si256(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}